

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nearest_neighbor.cc
# Opt level: O0

void __thiscall
features::NearestNeighbor<unsigned_short>::find
          (NearestNeighbor<unsigned_short> *this,unsigned_short *query,Result *result)

{
  int *piVar1;
  uint local_40 [3];
  int local_34;
  uint local_30 [3];
  int local_24;
  Result *local_20;
  Result *result_local;
  unsigned_short *query_local;
  NearestNeighbor<unsigned_short> *this_local;
  
  result->dist_1st_best = 0;
  result->dist_2nd_best = 0;
  result->index_1st_best = 0;
  result->index_2nd_best = 0;
  local_20 = result;
  result_local = (Result *)query;
  query_local = (unsigned_short *)this;
  anon_unknown_1::short_inner_prod<unsigned_short>
            (query,result,*(unsigned_short **)(this + 8),*(int *)(this + 4),*(int *)this);
  local_24 = 0xfe01;
  local_30[2] = (uint)local_20->dist_1st_best;
  piVar1 = std::min<int>(&local_24,(int *)(local_30 + 2));
  local_20->dist_1st_best = (unsigned_short)*piVar1;
  local_30[1] = 0xfe01;
  local_30[0] = (uint)local_20->dist_2nd_best;
  piVar1 = std::min<int>((int *)(local_30 + 1),(int *)local_30);
  local_20->dist_2nd_best = (unsigned_short)*piVar1;
  local_20->dist_1st_best = -local_20->dist_1st_best - 0x1ff;
  local_20->dist_2nd_best = -local_20->dist_2nd_best - 0x1ff;
  local_34 = 0x7fff;
  local_40[2] = (uint)local_20->dist_1st_best;
  piVar1 = std::min<int>(&local_34,(int *)(local_40 + 2));
  local_20->dist_1st_best = (unsigned_short)(*piVar1 << 1);
  local_40[1] = 0x7fff;
  local_40[0] = (uint)local_20->dist_2nd_best;
  piVar1 = std::min<int>((int *)(local_40 + 1),(int *)local_40);
  local_20->dist_2nd_best = (unsigned_short)(*piVar1 << 1);
  return;
}

Assistant:

void
NearestNeighbor<unsigned short>::find (unsigned short const* query,
    NearestNeighbor<unsigned short>::Result* result) const
{
    /* Result distances are shamelessly misused to store inner products. */
    result->dist_1st_best = 0;
    result->dist_2nd_best = 0;
    result->index_1st_best = 0;
    result->index_2nd_best = 0;

    short_inner_prod<unsigned short>(query, result, this->elements,
        this->num_elements, this->dimensions);

    /*
     * Compute actual square distances.
     * The distance with 'unsigned char' vectors is: 2 * 255^2 - 2 * <Q, Ci>.
     * The maximum distance is (2*255)^2, which unfortunately does not fit
     * in a unsigned short. Therefore, the result distance is clapmed:
     * 2 * 255^2 - 2 * <Q, Ci> = 2 * (255^2 - <Q, Ci>) and (255^2 - <Q, Ci>)
     * is clamped to 32767 and then multiplied by 2.
     */
    result->dist_1st_best = std::min(65025, (int)result->dist_1st_best);
    result->dist_2nd_best = std::min(65025, (int)result->dist_2nd_best);
    result->dist_1st_best = 65025 - result->dist_1st_best;
    result->dist_2nd_best = 65025 - result->dist_2nd_best;
    result->dist_1st_best = std::min(32767, (int)result->dist_1st_best) * 2;
    result->dist_2nd_best = std::min(32767, (int)result->dist_2nd_best) * 2;
}